

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.hpp
# Opt level: O2

void __thiscall
defyx::CompiledVm<defyx::LargePageAllocator,_true>::CompiledVm
          (CompiledVm<defyx::LargePageAllocator,_true> *this)

{
  *(undefined8 *)&this->field_0x3e8 = 0;
  *(undefined8 *)&this->field_0x3f8 = 0;
  *(undefined1 **)&this->field_0x408 = &this->field_0x418;
  *(undefined8 *)&this->field_0x410 = 0;
  this->field_0x418 = 0;
  *(undefined ***)this = &PTR__CompiledVm_001309a0;
  JitCompilerX86::JitCompilerX86(&this->compiler);
  return;
}

Assistant:

void* operator new(size_t size) {
			void* ptr = AlignedAllocator<CacheLineSize>::allocMemory(size);
			if (ptr == nullptr)
				throw std::bad_alloc();
			return ptr;
		}